

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O0

void __thiscall QInputDialogPrivate::textChanged(QInputDialogPrivate *this,QString *text)

{
  bool bVar1;
  QString *in_RSI;
  QInputDialogPrivate *in_RDI;
  QInputDialog *q;
  QString *in_stack_ffffffffffffffd8;
  
  q_func(in_RDI);
  bVar1 = ::operator!=((QString *)in_RDI,in_stack_ffffffffffffffd8);
  if (bVar1) {
    QString::operator=(&in_RDI->textValue,in_RSI);
    QInputDialog::textValueChanged((QInputDialog *)in_RDI,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

void QInputDialogPrivate::textChanged(const QString &text)
{
    Q_Q(QInputDialog);
    if (textValue != text) {
        textValue = text;
        emit q->textValueChanged(text);
    }
}